

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::SessionImpl
          (SessionImpl *this,Pimpl *v,
          unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_> *p)

{
  bool condition;
  unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_> *p_local;
  Pimpl *v_local;
  SessionImpl *this_local;
  
  Venue::Session::Session(&this->super_Session);
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__SessionImpl_0058b7f8;
  this->maxBlockSize = 0;
  this->venue = v;
  TaskThread::Queue::Queue(&this->taskQueue,&this->venue->taskThread);
  std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::unique_ptr
            (&this->performer,p);
  std::atomic<soul::SessionState>::atomic(&this->state,empty);
  std::atomic<unsigned_long>::atomic(&this->totalFramesRendered,0);
  std::function<void_(unsigned_int)>::function(&this->beginNextBlockCallback);
  std::function<unsigned_int_(unsigned_int)>::function(&this->getBlockSizeCallback);
  std::function<void_(soul::Venue::Session::InputEndpointActions_&,_unsigned_int)>::function
            (&this->preRenderCallback);
  std::function<void_(soul::Venue::Session::OutputEndpointActions_&,_unsigned_int)>::function
            (&this->postRenderCallback);
  condition = std::operator!=(&this->performer,(nullptr_t)0x0);
  checkAssertion(condition,"performer != nullptr","SessionImpl",0xdd);
  TaskThread::Queue::attach(&this->taskQueue);
  return;
}

Assistant:

SessionImpl (Pimpl& v, std::unique_ptr<soul::Performer> p)
            : venue (v),
              taskQueue (venue.taskThread),
              performer (std::move (p))
        {
            SOUL_ASSERT (performer != nullptr);
            taskQueue.attach();
        }